

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Crop_x86_avx::forward(Crop_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined8 uVar31;
  int *piVar38;
  int iVar39;
  long lVar40;
  sbyte sVar41;
  long lVar42;
  ulong uVar43;
  int iVar44;
  uint uVar45;
  void *__ptr;
  int iVar46;
  Allocator *pAVar47;
  uint uVar48;
  int *piVar49;
  int iVar50;
  ulong uVar51;
  ulong uVar52;
  Option *pOVar53;
  bool bVar54;
  int _outw;
  int _outh;
  int _woffset;
  Mat m;
  int _outc;
  int _outd;
  int _hoffset;
  Option *local_100;
  Mat m_1;
  int _coffset;
  size_t local_a0;
  ulong local_98;
  int local_8c;
  int _doffset;
  int local_84;
  Mat m_2;
  undefined4 uVar25;
  undefined3 uVar27;
  undefined2 uVar29;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined3 uVar34;
  undefined1 uVar35;
  undefined2 uVar36;
  undefined1 uVar37;
  
  iVar39 = bottom_blob->w;
  lVar40 = (long)iVar39;
  iVar50 = bottom_blob->h;
  lVar42 = (long)iVar50;
  local_84 = bottom_blob->d;
  uVar48 = bottom_blob->c;
  local_98 = (ulong)uVar48;
  iVar46 = bottom_blob->elempack;
  m.w = iVar39;
  m.h = iVar50;
  m.d = local_84;
  local_100 = opt;
  if (iVar46 != 4) {
    if (iVar46 != 8) goto switchD_00292000_default;
    iVar44 = bottom_blob->dims + -1;
    switch(iVar44) {
    case 0:
      m.cstep = lVar40 << 3;
      m.dims = 1;
      m.w = (int)m.cstep;
      m.h = 1;
      m.d = 1;
      m.c = 1;
      goto LAB_00291d7f;
    case 1:
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 2;
      m.h = (int)(lVar42 * 8);
      m.d = 1;
      m.c = 1;
      m.cstep = lVar42 * 8 * lVar40;
      break;
    case 2:
      m.dims = 3;
      m.d = 1;
      lVar42 = lVar42 * lVar40;
      goto LAB_00291d6e;
    case 3:
      m.dims = 4;
      lVar42 = lVar42 * lVar40 * (long)local_84;
LAB_00291d6e:
      m.c = uVar48 * 8;
      m.cstep = lVar42 + 3U & 0x3ffffffffffffffc;
LAB_00291d7f:
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      break;
    default:
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    local_a0 = bottom_blob->elemsize;
    local_8c = iVar46;
    Crop::resolve_crop_roi
              ((Crop *)((long)&this->_vptr_Crop_x86_avx + (long)this->_vptr_Crop_x86_avx[-3]),&m,
               &_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar49 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar49 != (int *)0x0) {
      LOCK();
      *piVar49 = *piVar49 + -1;
      UNLOCK();
      if (*piVar49 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pOVar53 = local_100;
    iVar46 = local_8c;
    switch(iVar44) {
    case 0:
      uVar48 = _outw & 7;
      bVar54 = (_outw & 3U) == 0;
      iVar50 = 8;
      if (uVar48 != 0) {
        iVar50 = (uint)bVar54 * 3 + 1;
      }
      sVar41 = 3;
      if (uVar48 != 0) {
        sVar41 = bVar54 * '\x02';
      }
      uVar43 = (long)_outw % (long)iVar50;
      if (iVar39 != _outw / iVar50 || uVar48 != 0) {
        if (((_outw | _woffset) & 7U) == 0) {
          Mat::create(top_blob,_outw / iVar50,(local_a0 >> 3) << sVar41,8,local_100->blob_allocator)
          ;
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar39 = _woffset + 7;
            if (-1 < _woffset) {
              iVar39 = _woffset;
            }
            crop_pack8_avx(bottom_blob,top_blob,0,iVar39 >> 3);
            return 0;
          }
          return -100;
        }
        break;
      }
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar49 = bottom_blob->refcount;
      if (piVar49 != (int *)0x0) {
        LOCK();
        *piVar49 = *piVar49 + 1;
        UNLOCK();
      }
      piVar49 = top_blob->refcount;
      if (piVar49 == (int *)0x0) goto LAB_00292da2;
      LOCK();
      *piVar49 = *piVar49 + -1;
      UNLOCK();
      if (*piVar49 != 0) goto LAB_00292da2;
      __ptr = top_blob->data;
      pAVar47 = top_blob->allocator;
      if (pAVar47 != (Allocator *)0x0) goto LAB_002928c9;
      if (__ptr == (void *)0x0) goto LAB_00292da2;
      goto LAB_00292d9a;
    case 1:
      sVar41 = 3;
      if ((_outh & 7U) != 0) {
        sVar41 = ((_outh & 3U) == 0) * '\x02';
      }
      if (_outw != iVar39) {
LAB_0029256f:
        if (((_hoffset | _outh) & 7U) == 0) {
          iVar39 = _outh + 7;
          if (-1 < _outh) {
            iVar39 = _outh;
          }
          Mat::create(top_blob,_outw,iVar39 >> 3,(local_a0 >> 3) << sVar41,8,
                      local_100->blob_allocator);
          if (top_blob->data != (void *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar39 = _hoffset + 7;
              if (-1 < _hoffset) {
                iVar39 = _hoffset;
              }
              crop_pack8_avx(bottom_blob,top_blob,iVar39 >> 3,_woffset);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      }
      iVar39 = 8;
      if ((_outh & 7U) != 0) {
        iVar39 = (uint)((_outh & 3U) == 0) * 3 + 1;
      }
      uVar43 = (long)_outh % (long)iVar39;
      if (((_outh & 7U) != 0) || (_outh / iVar39 != iVar50)) goto LAB_0029256f;
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar49 = bottom_blob->refcount;
      if (piVar49 != (int *)0x0) {
        LOCK();
        *piVar49 = *piVar49 + 1;
        UNLOCK();
      }
      piVar49 = top_blob->refcount;
      if (piVar49 == (int *)0x0) goto LAB_00292da2;
      LOCK();
      *piVar49 = *piVar49 + -1;
      UNLOCK();
      if (*piVar49 != 0) goto LAB_00292da2;
      __ptr = top_blob->data;
      pAVar47 = top_blob->allocator;
      goto joined_r0x00292252;
    case 2:
      uVar51 = local_a0 >> 3;
      sVar41 = 3;
      if ((_outc & 7U) != 0) {
        sVar41 = ((_outc & 3U) == 0) * '\x02';
      }
      if (iVar50 == _outh && iVar39 == _outw) {
        iVar44 = 8;
        if ((_outc & 7U) != 0) {
          iVar44 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        uVar43 = (long)_outc % (long)iVar44;
        if (((_outc & 7U) == 0) && (_outc / iVar44 == (int)local_98)) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar49 = bottom_blob->refcount;
          if (piVar49 != (int *)0x0) {
            LOCK();
            *piVar49 = *piVar49 + 1;
            UNLOCK();
          }
          piVar49 = top_blob->refcount;
          if (piVar49 == (int *)0x0) goto LAB_00292da2;
          LOCK();
          *piVar49 = *piVar49 + -1;
          UNLOCK();
          if (*piVar49 != 0) goto LAB_00292da2;
          __ptr = top_blob->data;
          pAVar47 = top_blob->allocator;
          goto joined_r0x00292252;
        }
      }
      if (((_coffset | _outc) & 7U) != 0) break;
      iVar46 = _coffset + 7;
      if (-1 < _coffset) {
        iVar46 = _coffset;
      }
      iVar44 = _outc + 7;
      if (-1 < _outc) {
        iVar44 = _outc;
      }
      iVar44 = iVar44 >> 3;
      uVar43 = bottom_blob->elemsize;
      m.data = (void *)((long)(iVar46 >> 3) * bottom_blob->cstep * uVar43 + (long)bottom_blob->data)
      ;
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar43;
      m.elemsize._4_4_ = (undefined4)(uVar43 >> 0x20);
      uVar3 = bottom_blob->dims;
      uVar4 = bottom_blob->w;
      uVar5 = bottom_blob->h;
      uVar6 = bottom_blob->d;
      m.cstep = ((long)bottom_blob->d * uVar43 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
                0xfffffffffffffff0) / uVar43;
      m.dims = uVar3;
      m.w = uVar4;
      m.h = uVar5;
      m.d = uVar6;
      m.c = iVar44;
      if (iVar50 != _outh || iVar39 != _outw) {
LAB_00293535:
        Mat::create(top_blob,_outw,_outh,iVar44,uVar51 << sVar41,8,pOVar53->blob_allocator);
        iVar39 = -100;
        if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
          if (0 < top_blob->c) {
            lVar40 = 0;
            do {
              m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
              m_1.data = (void *)(m.cstep * lVar40 * m_1.elemsize + (long)m.data);
              m_1.refcount = (int *)0x0;
              m_1.elempack = m.elempack;
              m_1.allocator = m.allocator;
              m_1.h = m.h;
              m_1.d = 1;
              m_1.c = m.d;
              m_1.w = m.w;
              m_1.dims = m.dims + -1;
              m_1.cstep = (m_1.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                          m_1.elemsize;
              if (m.dims == 4) {
                m_1.cstep = (long)m.h * (long)m.w;
              }
              m_2.w = top_blob->w;
              m_2.h = top_blob->h;
              m_2.elemsize = top_blob->elemsize;
              m_2.data = (void *)(top_blob->cstep * lVar40 * m_2.elemsize + (long)top_blob->data);
              m_2.elempack = top_blob->elempack;
              m_2.allocator = top_blob->allocator;
              m_2.refcount = (int *)0x0;
              m_2.c = top_blob->d;
              m_2.d = 1;
              m_2.dims = top_blob->dims + -1;
              m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                          m_2.elemsize;
              if (top_blob->dims == 4) {
                m_2.cstep = (long)m_2.h * (long)m_2.w;
              }
              crop_pack8_avx(&m_1,&m_2,_hoffset,_woffset);
              lVar40 = lVar40 + 1;
            } while (lVar40 < top_blob->c);
          }
          iVar39 = 0;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,iVar44,(void *)(ulong)(uint)_outh);
        if (&m_1 != top_blob) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar49 = top_blob->refcount;
          if (piVar49 != (int *)0x0) {
            LOCK();
            *piVar49 = *piVar49 + -1;
            UNLOCK();
            if (*piVar49 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = m_1.data;
          top_blob->refcount = m_1.refcount;
          top_blob->elemsize = m_1.elemsize;
          top_blob->elempack = m_1.elempack;
          top_blob->allocator = m_1.allocator;
          top_blob->dims = m_1.dims;
          top_blob->w = m_1.w;
          top_blob->h = m_1.h;
          top_blob->d = m_1.d;
          top_blob->c = m_1.c;
          top_blob->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar39 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          iVar44 = _outc + 7;
          if (-1 < _outc) {
            iVar44 = _outc;
          }
          iVar44 = iVar44 >> 3;
          goto LAB_00293535;
        }
      }
      piVar49 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar49 == (int *)0x0) {
        return iVar39;
      }
      LOCK();
      *piVar49 = *piVar49 + -1;
      UNLOCK();
      if (*piVar49 != 0) {
        return iVar39;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar39;
      }
      goto joined_r0x00293a7d;
    case 3:
      uVar51 = local_a0 >> 3;
      sVar41 = 3;
      if ((_outc & 7U) != 0) {
        sVar41 = ((_outc & 3U) == 0) * '\x02';
      }
      if (local_84 == _outd && (iVar50 == _outh && iVar39 == _outw)) {
        iVar44 = 8;
        if ((_outc & 7U) != 0) {
          iVar44 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        uVar43 = (long)_outc % (long)iVar44;
        if (((_outc & 7U) == 0) && (_outc / iVar44 == (int)local_98)) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar49 = bottom_blob->refcount;
          if (piVar49 != (int *)0x0) {
            LOCK();
            *piVar49 = *piVar49 + 1;
            UNLOCK();
          }
          piVar49 = top_blob->refcount;
          if (piVar49 == (int *)0x0) goto LAB_00292da2;
          LOCK();
          *piVar49 = *piVar49 + -1;
          UNLOCK();
          if (*piVar49 != 0) goto LAB_00292da2;
          __ptr = top_blob->data;
          pAVar47 = top_blob->allocator;
          goto joined_r0x00292252;
        }
      }
      if (((_coffset | _outc) & 7U) == 0) {
        iVar46 = _coffset + 7;
        if (-1 < _coffset) {
          iVar46 = _coffset;
        }
        iVar44 = _outc + 7;
        if (-1 < _outc) {
          iVar44 = _outc;
        }
        uVar48 = iVar44 >> 3;
        uVar43 = bottom_blob->elemsize;
        m.data = (void *)((long)(iVar46 >> 3) * bottom_blob->cstep * uVar43 +
                         (long)bottom_blob->data);
        m.elempack = bottom_blob->elempack;
        m.allocator = bottom_blob->allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar43;
        m.elemsize._4_4_ = (undefined4)(uVar43 >> 0x20);
        uVar7 = bottom_blob->dims;
        uVar8 = bottom_blob->w;
        uVar9 = bottom_blob->h;
        uVar10 = bottom_blob->d;
        m.cstep = ((long)bottom_blob->d * uVar43 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf
                  & 0xfffffffffffffff0) / uVar43;
        m.dims = uVar7;
        m.w = uVar8;
        m.h = uVar9;
        m.d = uVar10;
        m.c = uVar48;
        if (local_84 != _outd || (iVar50 != _outh || iVar39 != _outw)) {
LAB_0029385d:
          Mat::create(top_blob,_outw,_outh,_outd,uVar48,uVar51 << sVar41,8,pOVar53->blob_allocator);
          iVar39 = -100;
          if (top_blob->data != (void *)0x0) {
            uVar51 = (ulong)top_blob->c;
            if (top_blob->cstep * uVar51 != 0) {
              if (0 < top_blob->c) {
                uVar43 = (ulong)(uint)_outd;
                lVar40 = 0;
                do {
                  if (0 < (int)uVar43) {
                    lVar42 = 0;
                    do {
                      m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                      m_1.cstep = (long)m.h * (long)m.w;
                      m_1.data = (void *)((long)m.data +
                                         (long)(_doffset + (int)lVar42) * m_1.elemsize * m_1.cstep +
                                         m.cstep * lVar40 * m_1.elemsize);
                      m_1.refcount = (int *)0x0;
                      m_1.elempack = m.elempack;
                      m_1.allocator = m.allocator;
                      m_1.w = m.w;
                      m_1.dims = 2;
                      m_1.h = m.h;
                      m_1.d = 1;
                      m_1.c = 1;
                      m_2.w = top_blob->w;
                      m_2.h = top_blob->h;
                      m_2.elemsize = top_blob->elemsize;
                      m_2.elempack = top_blob->elempack;
                      m_2.allocator = top_blob->allocator;
                      m_2.cstep = (long)m_2.h * (long)m_2.w;
                      m_2.data = (void *)((long)top_blob->data +
                                         lVar42 * m_2.elemsize * m_2.cstep +
                                         top_blob->cstep * lVar40 * m_2.elemsize);
                      m_2.refcount = (int *)0x0;
                      m_2.dims = 2;
                      m_2.d = 1;
                      m_2.c = 1;
                      crop_pack8_avx(&m_1,&m_2,_hoffset,_woffset);
                      uVar43 = (ulong)_outd;
                      lVar42 = lVar42 + 1;
                    } while (lVar42 < (long)uVar43);
                    uVar51 = (ulong)(uint)top_blob->c;
                  }
                  lVar40 = lVar40 + 1;
                } while (lVar40 < (int)uVar51);
              }
              iVar39 = 0;
            }
          }
        }
        else {
          Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outd,(void *)(ulong)uVar48);
          pOVar53 = local_100;
          if (&m_1 != top_blob) {
            if (m_1.refcount != (int *)0x0) {
              LOCK();
              *m_1.refcount = *m_1.refcount + 1;
              UNLOCK();
            }
            piVar49 = top_blob->refcount;
            if (piVar49 != (int *)0x0) {
              LOCK();
              *piVar49 = *piVar49 + -1;
              UNLOCK();
              if (*piVar49 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = m_1.data;
            top_blob->refcount = m_1.refcount;
            top_blob->elemsize = m_1.elemsize;
            top_blob->elempack = m_1.elempack;
            top_blob->allocator = m_1.allocator;
            top_blob->dims = m_1.dims;
            top_blob->w = m_1.w;
            top_blob->h = m_1.h;
            top_blob->d = m_1.d;
            top_blob->c = m_1.c;
            top_blob->cstep = m_1.cstep;
          }
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + -1;
            UNLOCK();
            if (*m_1.refcount == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar39 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            iVar39 = _outc + 7;
            if (-1 < _outc) {
              iVar39 = _outc;
            }
            uVar48 = iVar39 >> 3;
            goto LAB_0029385d;
          }
        }
        piVar49 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar49 == (int *)0x0) {
          return iVar39;
        }
        LOCK();
        *piVar49 = *piVar49 + -1;
        UNLOCK();
        if (*piVar49 != 0) {
          return iVar39;
        }
        if (m.allocator != (Allocator *)0x0) {
          (*(m.allocator)->_vptr_Allocator[3])();
          return iVar39;
        }
        goto joined_r0x00293a7d;
      }
    }
    goto switchD_00292000_default;
  }
  uVar45 = bottom_blob->dims - 1;
  uVar51 = (ulong)uVar45;
  switch(uVar51) {
  case 0:
    m.cstep = lVar40 << 2;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    goto LAB_00291e43;
  case 1:
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)(lVar42 * 4);
    m.d = 1;
    m.c = 1;
    m.cstep = lVar42 * 4 * lVar40;
    break;
  case 2:
    m.dims = 3;
    m.d = 1;
    lVar42 = lVar42 * lVar40;
    goto LAB_00291e32;
  case 3:
    m.dims = 4;
    lVar42 = lVar42 * lVar40 * (long)local_84;
LAB_00291e32:
    m.c = uVar48 * 4;
    m.cstep = lVar42 + 3U & 0x3ffffffffffffffc;
LAB_00291e43:
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  piVar49 = &_doffset;
  local_a0 = bottom_blob->elemsize;
  local_8c = iVar46;
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86_avx + (long)this->_vptr_Crop_x86_avx[-3]),&m,
             &_woffset,&_hoffset,piVar49,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar38 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar38 != (int *)0x0) {
    LOCK();
    *piVar38 = *piVar38 + -1;
    UNLOCK();
    if (*piVar38 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  pOVar53 = local_100;
  iVar46 = local_8c;
  if (3 < uVar45) goto switchD_00292000_default;
  iVar44 = _outc >> 2;
  switch(uVar51) {
  case 0:
    uVar48 = _outw & 3;
    iVar50 = (uint)(uVar48 == 0) * 3 + 1;
    uVar43 = (long)_outw % (long)iVar50;
    if (iVar39 == _outw / iVar50 && uVar48 == 0) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar49 = bottom_blob->refcount;
      if (piVar49 != (int *)0x0) {
        LOCK();
        *piVar49 = *piVar49 + 1;
        UNLOCK();
      }
      piVar49 = top_blob->refcount;
      if (piVar49 == (int *)0x0) goto LAB_00292da2;
      LOCK();
      *piVar49 = *piVar49 + -1;
      UNLOCK();
      if (*piVar49 != 0) goto LAB_00292da2;
      __ptr = top_blob->data;
      pAVar47 = top_blob->allocator;
joined_r0x00292252:
      if (pAVar47 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
LAB_00292d9a:
          free(__ptr);
        }
      }
      else {
LAB_002928c9:
        (*pAVar47->_vptr_Allocator[3])(pAVar47,__ptr,uVar43 & 0xffffffff);
      }
LAB_00292da2:
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar49 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar49;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar39 = bottom_blob->w;
      iVar50 = bottom_blob->h;
      iVar46 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar39;
      top_blob->h = iVar50;
      top_blob->d = iVar46;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 3U) == 0) {
      Mat::create(top_blob,_outw / iVar50,(local_a0 >> 2) << (uVar48 == 0) * '\x02',iVar50,
                  local_100->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        iVar39 = _woffset + 3;
        if (-1 < _woffset) {
          iVar39 = _woffset;
        }
        crop_pack4_sse(bottom_blob,top_blob,0,iVar39 >> 2);
        return 0;
      }
      return -100;
    }
    break;
  case 1:
    if (_outw == iVar39) {
      iVar39 = (uint)((_outh & 3U) == 0) * 3 + 1;
      uVar43 = (long)_outh % (long)iVar39;
      if (((_outh & 3U) == 0) && (_outh / iVar39 == iVar50)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar49 = bottom_blob->refcount;
        if (piVar49 != (int *)0x0) {
          LOCK();
          *piVar49 = *piVar49 + 1;
          UNLOCK();
        }
        piVar49 = top_blob->refcount;
        if (piVar49 == (int *)0x0) goto LAB_00292da2;
        LOCK();
        *piVar49 = *piVar49 + -1;
        UNLOCK();
        if (*piVar49 != 0) goto LAB_00292da2;
        __ptr = top_blob->data;
        pAVar47 = top_blob->allocator;
        goto joined_r0x00292252;
      }
    }
    if (((_hoffset | _outh) & 3U) == 0) {
      Mat::create(top_blob,_outw,_outh >> 2,(local_a0 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                  local_100->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        iVar39 = _hoffset + 3;
        if (-1 < _hoffset) {
          iVar39 = _hoffset;
        }
        crop_pack4_sse(bottom_blob,top_blob,iVar39 >> 2,_woffset);
        return 0;
      }
      return -100;
    }
    break;
  case 2:
    uVar48 = _outc & 3;
    uVar52 = local_a0 >> 2;
    bVar54 = iVar50 == _outh;
    bVar1 = iVar39 == _outw;
    if (bVar54 && bVar1) {
      iVar39 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar43 = (long)_outc % (long)iVar39;
      if (((_outc & 3U) == 0) && (_outc / iVar39 == (int)local_98)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar49 = bottom_blob->refcount;
        if (piVar49 != (int *)0x0) {
          LOCK();
          *piVar49 = *piVar49 + 1;
          UNLOCK();
        }
        piVar49 = top_blob->refcount;
        if (piVar49 == (int *)0x0) goto LAB_00292da2;
        LOCK();
        *piVar49 = *piVar49 + -1;
        UNLOCK();
        if (*piVar49 != 0) goto LAB_00292da2;
        __ptr = top_blob->data;
        pAVar47 = top_blob->allocator;
        goto joined_r0x00292252;
      }
    }
    if (((_coffset | _outc) & 3U) != 0) break;
    uVar43 = bottom_blob->elemsize;
    m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar43 + (long)bottom_blob->data)
    ;
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = (undefined4)uVar43;
    m.elemsize._4_4_ = (undefined4)(uVar43 >> 0x20);
    uVar11 = bottom_blob->dims;
    uVar12 = bottom_blob->w;
    uVar13 = bottom_blob->h;
    uVar14 = bottom_blob->d;
    m.cstep = ((long)bottom_blob->d * uVar43 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
              0xfffffffffffffff0) / uVar43;
    m.dims = uVar11;
    m.w = uVar12;
    m.h = uVar13;
    m.d = uVar14;
    m.c = iVar44;
    if (bVar54 && bVar1) {
      Mat::clone(&m_1,(__fn *)&m,(void *)0x0,
                 (int)CONCAT71((int7)((ulong)((long)&switchD_00292613::switchdataD_00518998 +
                                             (long)(int)(&switchD_00292613::switchdataD_00518998)
                                                        [uVar51]) >> 8),bVar54 && bVar1),
                 (void *)(ulong)(uint)_outh);
      if (&m_1 != top_blob) {
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + 1;
          UNLOCK();
        }
        piVar49 = top_blob->refcount;
        if (piVar49 != (int *)0x0) {
          LOCK();
          *piVar49 = *piVar49 + -1;
          UNLOCK();
          if (*piVar49 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = m_1.data;
        top_blob->refcount = m_1.refcount;
        top_blob->elemsize = m_1.elemsize;
        top_blob->elempack = m_1.elempack;
        top_blob->allocator = m_1.allocator;
        top_blob->dims = m_1.dims;
        top_blob->w = m_1.w;
        top_blob->h = m_1.h;
        top_blob->d = m_1.d;
        top_blob->c = m_1.c;
        top_blob->cstep = m_1.cstep;
      }
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar39 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
      goto LAB_00292ef6;
    }
    else {
LAB_00292ef6:
      iVar39 = _outc + 3;
      if (-1 < _outc) {
        iVar39 = _outc;
      }
      Mat::create(top_blob,_outw,_outh,iVar39 >> 2,uVar52 << (uVar48 == 0) * '\x02',4,
                  pOVar53->blob_allocator);
      iVar39 = -100;
      if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
        if (0 < top_blob->c) {
          lVar40 = 0;
          do {
            m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
            m_1.data = (void *)(m.cstep * lVar40 * m_1.elemsize + (long)m.data);
            m_1.refcount = (int *)0x0;
            m_1.elempack = m.elempack;
            m_1.allocator = m.allocator;
            m_1.h = m.h;
            m_1.d = 1;
            m_1.c = m.d;
            m_1.w = m.w;
            m_1.dims = m.dims + -1;
            m_1.cstep = (m_1.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                        m_1.elemsize;
            if (m.dims == 4) {
              m_1.cstep = (long)m.h * (long)m.w;
            }
            m_2.w = top_blob->w;
            m_2.h = top_blob->h;
            m_2.elemsize = top_blob->elemsize;
            m_2.data = (void *)(top_blob->cstep * lVar40 * m_2.elemsize + (long)top_blob->data);
            m_2.elempack = top_blob->elempack;
            m_2.allocator = top_blob->allocator;
            m_2.refcount = (int *)0x0;
            m_2.c = top_blob->d;
            m_2.d = 1;
            m_2.dims = top_blob->dims + -1;
            m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                        m_2.elemsize;
            if (top_blob->dims == 4) {
              m_2.cstep = (long)m_2.h * (long)m_2.w;
            }
            crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
            lVar40 = lVar40 + 1;
          } while (lVar40 < top_blob->c);
        }
        iVar39 = 0;
      }
    }
    piVar49 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar49 == (int *)0x0) {
      return iVar39;
    }
    LOCK();
    *piVar49 = *piVar49 + -1;
    UNLOCK();
    if (*piVar49 != 0) {
      return iVar39;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar39;
    }
joined_r0x00293a7d:
    m.allocator = (Allocator *)0x0;
    if (m.data == (void *)0x0) {
      return iVar39;
    }
    goto LAB_00292cf7;
  case 3:
    uVar48 = _outc & 3;
    uVar51 = local_a0 >> 2;
    bVar54 = local_84 == _outd;
    bVar1 = iVar50 == _outh;
    bVar2 = iVar39 == _outw;
    if (bVar54 && (bVar1 && bVar2)) {
      iVar39 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar43 = (long)_outc % (long)iVar39;
      if (((_outc & 3U) == 0) && (_outc / iVar39 == (int)local_98)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar49 = bottom_blob->refcount;
        if (piVar49 != (int *)0x0) {
          LOCK();
          *piVar49 = *piVar49 + 1;
          UNLOCK();
        }
        piVar49 = top_blob->refcount;
        if (piVar49 == (int *)0x0) goto LAB_00292da2;
        LOCK();
        *piVar49 = *piVar49 + -1;
        UNLOCK();
        if (*piVar49 != 0) goto LAB_00292da2;
        __ptr = top_blob->data;
        pAVar47 = top_blob->allocator;
        goto joined_r0x00292252;
      }
    }
    if (((_coffset | _outc) & 3U) == 0) {
      uVar43 = bottom_blob->elemsize;
      m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar43 +
                       (long)bottom_blob->data);
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar43;
      m.elemsize._4_4_ = (undefined4)(uVar43 >> 0x20);
      uVar15 = bottom_blob->dims;
      uVar16 = bottom_blob->w;
      uVar17 = bottom_blob->h;
      uVar18 = bottom_blob->d;
      m.cstep = ((long)bottom_blob->d * uVar43 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
                0xfffffffffffffff0) / uVar43;
      m.dims = uVar15;
      m.w = uVar16;
      m.h = uVar17;
      m.d = uVar18;
      m.c = iVar44;
      if (bVar54 && (bVar1 && bVar2)) {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outd,
                   (void *)CONCAT71((int7)((ulong)piVar49 >> 8),bVar54 && (bVar1 && bVar2)));
        pOVar53 = local_100;
        if (&m_1 != top_blob) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar49 = top_blob->refcount;
          if (piVar49 != (int *)0x0) {
            LOCK();
            *piVar49 = *piVar49 + -1;
            UNLOCK();
            if (*piVar49 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = m_1.data;
          top_blob->refcount = m_1.refcount;
          top_blob->elemsize = m_1.elemsize;
          top_blob->elempack = m_1.elempack;
          top_blob->allocator = m_1.allocator;
          top_blob->dims = m_1.dims;
          top_blob->w = m_1.w;
          top_blob->h = m_1.h;
          top_blob->d = m_1.d;
          top_blob->c = m_1.c;
          top_blob->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar39 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
        goto LAB_0029321b;
      }
      else {
LAB_0029321b:
        iVar39 = _outc + 3;
        if (-1 < _outc) {
          iVar39 = _outc;
        }
        Mat::create(top_blob,_outw,_outh,_outd,iVar39 >> 2,uVar51 << (uVar48 == 0) * '\x02',4,
                    pOVar53->blob_allocator);
        iVar39 = -100;
        if (top_blob->data != (void *)0x0) {
          uVar51 = (ulong)top_blob->c;
          if (top_blob->cstep * uVar51 != 0) {
            if (0 < top_blob->c) {
              uVar43 = (ulong)(uint)_outd;
              lVar40 = 0;
              do {
                if (0 < (int)uVar43) {
                  lVar42 = 0;
                  do {
                    m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                    m_1.cstep = (long)m.h * (long)m.w;
                    m_1.data = (void *)((long)m.data +
                                       (long)(_doffset + (int)lVar42) * m_1.elemsize * m_1.cstep +
                                       m.cstep * lVar40 * m_1.elemsize);
                    m_1.refcount = (int *)0x0;
                    m_1.elempack = m.elempack;
                    m_1.allocator = m.allocator;
                    m_1.w = m.w;
                    m_1.dims = 2;
                    m_1.h = m.h;
                    m_1.d = 1;
                    m_1.c = 1;
                    m_2.w = top_blob->w;
                    m_2.h = top_blob->h;
                    m_2.elemsize = top_blob->elemsize;
                    m_2.elempack = top_blob->elempack;
                    m_2.allocator = top_blob->allocator;
                    m_2.cstep = (long)m_2.h * (long)m_2.w;
                    m_2.data = (void *)((long)top_blob->data +
                                       lVar42 * m_2.elemsize * m_2.cstep +
                                       top_blob->cstep * lVar40 * m_2.elemsize);
                    m_2.refcount = (int *)0x0;
                    m_2.dims = 2;
                    m_2.d = 1;
                    m_2.c = 1;
                    crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
                    uVar43 = (ulong)_outd;
                    lVar42 = lVar42 + 1;
                  } while (lVar42 < (long)uVar43);
                  uVar51 = (ulong)(uint)top_blob->c;
                }
                lVar40 = lVar40 + 1;
              } while (lVar40 < (int)uVar51);
            }
            iVar39 = 0;
          }
        }
      }
      piVar49 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar49 == (int *)0x0) {
        return iVar39;
      }
      LOCK();
      *piVar49 = *piVar49 + -1;
      UNLOCK();
      if (*piVar49 != 0) {
        return iVar39;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar39;
      }
      goto joined_r0x00293a7d;
    }
  }
switchD_00292000_default:
  pOVar53 = local_100;
  piVar49 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  m.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  m.elempack = bottom_blob->elempack;
  m.allocator = bottom_blob->allocator;
  uVar19 = bottom_blob->dims;
  uVar20 = bottom_blob->w;
  uVar21 = bottom_blob->h;
  uVar22 = bottom_blob->d;
  m.c = bottom_blob->c;
  m.cstep = bottom_blob->cstep;
  if (piVar49 != (int *)0x0) {
    LOCK();
    *piVar49 = *piVar49 + 1;
    UNLOCK();
  }
  m.dims = uVar19;
  m.w = uVar20;
  m.h = uVar21;
  m.d = uVar22;
  if (iVar46 != 1) {
    m_1.data = *(void **)local_100;
    m_1.elemsize = (size_t)local_100->workspace_allocator;
    m_1.elempack = local_100->openmp_blocktime;
    m_1._28_1_ = local_100->use_winograd_convolution;
    m_1._29_1_ = local_100->use_sgemm_convolution;
    m_1._30_1_ = local_100->use_int8_inference;
    m_1._31_1_ = local_100->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&local_100->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&local_100->use_shader_pack8;
    uVar23 = local_100->flush_denormals;
    uVar24 = local_100->use_local_pool_allocator;
    uVar26 = local_100->use_shader_local_memory;
    uVar28 = local_100->use_cooperative_matrix;
    uVar30 = local_100->use_winograd23_convolution;
    uVar29 = CONCAT11(uVar30,uVar28);
    uVar27 = CONCAT21(uVar29,uVar26);
    uVar25 = CONCAT31(uVar27,uVar24);
    uVar31._0_1_ = local_100->use_winograd43_convolution;
    uVar31._1_1_ = local_100->use_winograd63_convolution;
    uVar31._2_1_ = local_100->use_reserved_6;
    uVar31._3_1_ = local_100->use_reserved_7;
    uVar32 = local_100->use_reserved_8;
    uVar33 = local_100->use_reserved_9;
    uVar35 = local_100->use_reserved_10;
    uVar37 = local_100->use_reserved_11;
    uVar36 = CONCAT11(uVar37,uVar35);
    uVar34 = CONCAT21(uVar36,uVar33);
    uVar31._4_4_ = CONCAT31(uVar34,uVar32);
    m_1.c = (int)uVar31;
    m_1.refcount = (int *)local_100->workspace_allocator;
    m_1.h = uVar23;
    m_1.d = uVar25;
    m_1._60_4_ = uVar31._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar39 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86_avx +
                                 (long)this->_vptr_Crop_x86_avx[-3]),&m,top_blob,pOVar53);
  piVar49 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar49 != (int *)0x0) {
    LOCK();
    *piVar49 = *piVar49 + -1;
    UNLOCK();
    if (*piVar49 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
LAB_00292cf7:
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

int Crop_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}